

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O3

any * __thiscall
shadow::conversion_detail::generic_conversion_bind_point<long_double,unsigned_long_long>
          (any *__return_storage_ptr__,conversion_detail *this,any *src)

{
  float fVar1;
  long lVar2;
  holder_base *phVar3;
  conversion_detail *pcVar4;
  
  pcVar4 = this + 0x18;
  if (*this != (conversion_detail)0x0) {
    pcVar4 = (conversion_detail *)(*(long *)(this + 0x10) + 8);
  }
  lVar2 = *(long *)pcVar4;
  fVar1 = *(float *)(&DAT_00125010 + (ulong)(lVar2 < 0) * 4);
  __return_storage_ptr__->on_heap_ = true;
  phVar3 = (holder_base *)operator_new(0x20);
  phVar3->_vptr_holder_base = (_func_int **)&PTR_copy_0012ebc8;
  *(longdouble *)(phVar3 + 2) = (longdouble)lVar2 + (longdouble)fVar1;
  (__return_storage_ptr__->field_1).heap = phVar3;
  return __return_storage_ptr__;
}

Assistant:

any
generic_conversion_bind_point(const any& src)
{
    return conversion_specializer<TargetType, SourceType>::dispatch(src);
}